

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

bool __thiscall
duckdb::StringValueScanner::IsRowValid(StringValueScanner *this,CSVIterator *current_iterator)

{
  idx_t iVar1;
  bool bVar2;
  int iVar3;
  CSVBufferHandle *pCVar4;
  pointer pSVar5;
  undefined4 extraout_var;
  bool local_51;
  __uniq_ptr_impl<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
  local_50;
  shared_ptr<duckdb::CSVErrorHandler,_true> local_48;
  idx_t result_size;
  long lVar6;
  
  iVar1 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  pCVar4 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                     (&(this->super_BaseScanner).cur_buffer_handle);
  if (iVar1 != pCVar4->actual_size) {
    result_size = 1;
    make_shared_ptr<duckdb::CSVErrorHandler>();
    local_51 = false;
    make_uniq<duckdb::StringValueScanner,unsigned_long_const&,duckdb::shared_ptr<duckdb::CSVBufferManager,true>const&,duckdb::shared_ptr<duckdb::CSVStateMachine,true>const&,duckdb::shared_ptr<duckdb::CSVErrorHandler,true>,duckdb::shared_ptr<duckdb::CSVFileScan,true>const&,bool,duckdb::CSVIterator&,unsigned_long_const&>
              ((duckdb *)&local_50,&LINE_FINDER_ID,&(this->super_BaseScanner).buffer_manager,
               &this->state_machine_strict,&local_48,&(this->super_BaseScanner).csv_file_scan,
               &local_51,current_iterator,&result_size);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.internal.
                super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    pSVar5 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
             ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                           *)&local_50);
    iVar3 = (*(pSVar5->super_BaseScanner)._vptr_BaseScanner[2])(pSVar5);
    lVar6 = CONCAT44(extraout_var,iVar3);
    pSVar5 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
             ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                           *)&local_50);
    iVar1 = (pSVar5->super_BaseScanner).iterator.pos.buffer_pos;
    (current_iterator->pos).buffer_idx = (pSVar5->super_BaseScanner).iterator.pos.buffer_idx;
    (current_iterator->pos).buffer_pos = iVar1;
    if (((*(long *)(lVar6 + 0x220) == *(long *)(lVar6 + 0x228)) ||
        ((*(long *)(lVar6 + 0x228) - *(long *)(lVar6 + 0x220) == 0x58 &&
         (bVar2 = LineError::HasErrorType((LineError *)(lVar6 + 0x220),MAXIMUM_LINE_SIZE), bVar2))))
       && ((*(long *)(lVar6 + 0xf0) == 1 || (*(char *)(lVar6 + 0x398) == '\x01')))) {
      bVar2 = *(long *)(lVar6 + 0x358) == 0;
    }
    else {
      bVar2 = false;
    }
    if (local_50._M_t.
        super__Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
        .super__Head_base<0UL,_duckdb::StringValueScanner_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
         )0x0) {
      (**(code **)(*(long *)local_50._M_t.
                            super__Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
                            .super__Head_base<0UL,_duckdb::StringValueScanner_*,_false>._M_head_impl
                  + 8))();
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool StringValueScanner::IsRowValid(CSVIterator &current_iterator) const {
	if (iterator.pos.buffer_pos == cur_buffer_handle->actual_size) {
		return false;
	}
	constexpr idx_t result_size = 1;
	auto scan_finder = make_uniq<StringValueScanner>(StringValueScanner::LINE_FINDER_ID, buffer_manager,
	                                                 state_machine_strict, make_shared_ptr<CSVErrorHandler>(),
	                                                 csv_file_scan, false, current_iterator, result_size);
	auto &tuples = scan_finder->ParseChunk();
	current_iterator.pos = scan_finder->GetIteratorPosition();
	bool has_error = false;
	if (tuples.current_errors.HasError()) {
		if (tuples.current_errors.Size() != 1 || !tuples.current_errors.HasErrorType(MAXIMUM_LINE_SIZE)) {
			// We ignore maximum line size errors
			has_error = true;
		}
	}
	return (tuples.number_of_rows == 1 || tuples.first_line_is_comment) && !has_error && tuples.borked_rows.empty();
}